

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O1

tbx_t * tbx_index_load(char *fn)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  khint_t kVar4;
  tbx_t *__ptr;
  hts_idx_t *idx;
  uint8_t *puVar5;
  kh_s2i_t *h;
  char *pcVar6;
  size_t sVar7;
  uint8_t *key;
  int l_meta;
  int local_44;
  tbx_t *local_40;
  int local_34;
  
  __ptr = (tbx_t *)calloc(1,0x28);
  idx = hts_idx_load(fn,2);
  __ptr->idx = idx;
  if ((idx != (hts_idx_t *)0x0) &&
     (puVar5 = hts_idx_get_meta(idx,&local_34), puVar5 != (uint8_t *)0x0)) {
    iVar1 = *(int *)(puVar5 + 0x18);
    uVar2 = *(undefined8 *)(puVar5 + 0x10);
    (__ptr->conf).meta_char = (int)uVar2;
    (__ptr->conf).line_skip = (int)((ulong)uVar2 >> 0x20);
    uVar2 = *(undefined8 *)puVar5;
    uVar3 = *(undefined8 *)(puVar5 + 8);
    (__ptr->conf).preset = (int)uVar2;
    (__ptr->conf).sc = (int)((ulong)uVar2 >> 0x20);
    (__ptr->conf).bc = (int)uVar3;
    (__ptr->conf).ec = (int)((ulong)uVar3 >> 0x20);
    if ((long)iVar1 < 1) {
      return __ptr;
    }
    h = (kh_s2i_t *)__ptr->dict;
    key = puVar5 + 0x1c;
    local_40 = __ptr;
    do {
      if (h == (kh_s2i_t *)0x0) {
        h = kh_init_s2i();
      }
      kVar4 = kh_put_s2i(h,(kh_cstr_t)key,&local_44);
      if (local_44 != 0) {
        pcVar6 = strdup((char *)key);
        h->keys[kVar4] = pcVar6;
        h->vals[kVar4] = (ulong)(h->size - 1);
      }
      sVar7 = strlen((char *)key);
      key = key + sVar7 + 1;
    } while ((long)key - (long)(puVar5 + 0x1c) < (long)iVar1);
    local_40->dict = h;
    return local_40;
  }
  free(__ptr);
  return (tbx_t *)0x0;
}

Assistant:

tbx_t *tbx_index_load(const char *fn)
{
    tbx_t *tbx;
    uint8_t *meta;
    char *nm, *p;
    uint32_t x[7];
    int l_meta, l_nm;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->idx = hts_idx_load(fn, HTS_FMT_TBI);
    if ( !tbx->idx )
    {
        free(tbx);
        return NULL;
    }
    meta = hts_idx_get_meta(tbx->idx, &l_meta);
    if ( !meta )
    {
        free(tbx);
        return NULL;
    }
    memcpy(x, meta, 28);
    memcpy(&tbx->conf, x, 24);
    p = nm = (char*)meta + 28;
    l_nm = x[6];
    for (; p - nm < l_nm; p += strlen(p) + 1) get_tid(tbx, p, 1);
    return tbx;
}